

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
::product_evaluator(product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                    *this,XprType *xpr)

{
  LhsNestedCleaned *pLVar1;
  RhsNestedCleaned *pRVar2;
  Index IVar3;
  XprType *xpr_local;
  product_evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>,_4,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  *this_local;
  
  evaluator_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>
  ::evaluator_base((evaluator_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>_>
                    *)this);
  pLVar1 = Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ::lhs(xpr);
  CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
  ::CwiseBinaryOp(&this->m_lhs,pLVar1);
  pRVar2 = Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ::rhs(xpr);
  Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>::Map(&this->m_rhs,pRVar2);
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>_>
  ::evaluator(&this->m_lhsImpl,&this->m_lhs);
  evaluator<Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>_>::evaluator
            (&this->m_rhsImpl,&this->m_rhs);
  pLVar1 = Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>,_Eigen::Map<Eigen::Matrix<float,_1,_1,_1,_1,_1>,_0,_Eigen::Stride<0,_0>_>,_1>
           ::lhs(xpr);
  IVar3 = CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
          ::cols(pLVar1);
  this->m_innerDim = IVar3;
  return;
}

Assistant:

explicit product_evaluator(const XprType& xpr)
    : m_lhs(xpr.lhs()),
      m_rhs(xpr.rhs()),
      m_lhsImpl(m_lhs),     // FIXME the creation of the evaluator objects should result in a no-op, but check that!
      m_rhsImpl(m_rhs),     //       Moreover, they are only useful for the packet path, so we could completely disable them when not needed,
                            //       or perhaps declare them on the fly on the packet method... We have experiment to check what's best.
      m_innerDim(xpr.lhs().cols())
  {
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::MulCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(NumTraits<Scalar>::AddCost);
    EIGEN_INTERNAL_CHECK_COST_VALUE(CoeffReadCost);
#if 0
    std::cerr << "LhsOuterStrideBytes=  " << LhsOuterStrideBytes << "\n";
    std::cerr << "RhsOuterStrideBytes=  " << RhsOuterStrideBytes << "\n";
    std::cerr << "LhsAlignment=         " << LhsAlignment << "\n";
    std::cerr << "RhsAlignment=         " << RhsAlignment << "\n";
    std::cerr << "CanVectorizeLhs=      " << CanVectorizeLhs << "\n";
    std::cerr << "CanVectorizeRhs=      " << CanVectorizeRhs << "\n";
    std::cerr << "CanVectorizeInner=    " << CanVectorizeInner << "\n";
    std::cerr << "EvalToRowMajor=       " << EvalToRowMajor << "\n";
    std::cerr << "Alignment=            " << Alignment << "\n";
    std::cerr << "Flags=                " << Flags << "\n";
#endif
  }